

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * sendmsgtopeer(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff648;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff650;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff660;
  unsigned_long *in_stack_fffffffffffff670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff680;
  allocator<char> *in_stack_fffffffffffff688;
  iterator in_stack_fffffffffffff690;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffff698;
  string *in_stack_fffffffffffff6a0;
  Fallback *in_stack_fffffffffffff6a8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff6b0;
  string *in_stack_fffffffffffff6b8;
  RPCArg *in_stack_fffffffffffff6c0;
  RPCResults *this_00;
  RPCResult *this_01;
  undefined8 in_stack_fffffffffffff790;
  undefined8 in_stack_fffffffffffff798;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff7a0;
  pointer description;
  pointer name;
  pointer this_02;
  undefined1 local_83a [33];
  allocator<char> local_819 [8];
  allocator<char> local_811 [7];
  allocator<char> local_80a;
  allocator<char> local_809 [8];
  allocator<char> local_801 [31];
  allocator<char> local_7e2;
  allocator<char> local_7e1 [145];
  RPCMethodImpl *in_stack_fffffffffffff8b0;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  local_809[1] = (allocator<char>)0x0;
  local_809[2] = (allocator<char>)0x0;
  local_809[3] = (allocator<char>)0x0;
  local_809[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff658,(Optional *)in_stack_fffffffffffff650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::__cxx11::string::string(in_stack_fffffffffffff660);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff648);
  RPCArg::RPCArg(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
                 (Type)((ulong)in_stack_fffffffffffff6b0 >> 0x20),in_stack_fffffffffffff6a8,
                 in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  local_811[1] = (allocator<char>)0x0;
  local_811[2] = (allocator<char>)0x0;
  local_811[3] = (allocator<char>)0x0;
  local_811[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff658,(Optional *)in_stack_fffffffffffff650);
  tinyformat::format<unsigned_long>((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
  std::__cxx11::string::string(in_stack_fffffffffffff660);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff648);
  RPCArg::RPCArg(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
                 (Type)((ulong)in_stack_fffffffffffff6b0 >> 0x20),in_stack_fffffffffffff6a8,
                 in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  local_819[1] = (allocator<char>)0x0;
  local_819[2] = (allocator<char>)0x0;
  local_819[3] = (allocator<char>)0x0;
  local_819[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff658,(Optional *)in_stack_fffffffffffff650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::__cxx11::string::string(in_stack_fffffffffffff660);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff648);
  RPCArg::RPCArg(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
                 (Type)((ulong)in_stack_fffffffffffff6b0 >> 0x20),in_stack_fffffffffffff6a8,
                 in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff6a8 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff648);
  __l._M_len = (size_type)in_stack_fffffffffffff698;
  __l._M_array = in_stack_fffffffffffff690;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff688,__l,
             (allocator_type *)in_stack_fffffffffffff680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  this_01 = (RPCResult *)local_83a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  description = (pointer)0x0;
  name = (pointer)0x0;
  this_02 = (pointer)0x0;
  this_00 = (RPCResults *)&stack0xfffffffffffff7a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff648);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),&in_stack_fffffffffffff6c0->m_names,
             in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,(bool)skip_type_check);
  RPCResults::RPCResults(this_00,(RPCResult *)in_stack_fffffffffffff6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  HelpExampleCli(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  HelpExampleRpc(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  std::operator+(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff648,(string *)0x135e5d4);
  this = (RPCArg *)&stack0xfffffffffffff780;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<sendmsgtopeer()::__0,void>(in_stack_fffffffffffff658,in_stack_fffffffffffff650);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)this_02,&name->m_names,&description->m_names,in_stack_fffffffffffff7a0,
             (RPCResults *)in_stack_fffffffffffff798,(RPCExamples *)in_stack_fffffffffffff790,
             in_stack_fffffffffffff8b0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff7a4);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff7a5);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff7a6);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff7a7);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff658);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_83a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_83a + 1));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff658);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_819);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_811);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_80a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_809);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_801);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7e2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_7e1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan sendmsgtopeer()
{
    return RPCHelpMan{
        "sendmsgtopeer",
        "Send a p2p message to a peer specified by id.\n"
        "The message type and body must be provided, the message header will be generated.\n"
        "This RPC is for testing only.",
        {
            {"peer_id", RPCArg::Type::NUM, RPCArg::Optional::NO, "The peer to send the message to."},
            {"msg_type", RPCArg::Type::STR, RPCArg::Optional::NO, strprintf("The message type (maximum length %i)", CMessageHeader::COMMAND_SIZE)},
            {"msg", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The serialized message body to send, in hex, without a message header"},
        },
        RPCResult{RPCResult::Type::OBJ, "", "", std::vector<RPCResult>{}},
        RPCExamples{
            HelpExampleCli("sendmsgtopeer", "0 \"addr\" \"ffffff\"") + HelpExampleRpc("sendmsgtopeer", "0 \"addr\" \"ffffff\"")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
            const NodeId peer_id{request.params[0].getInt<int64_t>()};
            const std::string& msg_type{request.params[1].get_str()};
            if (msg_type.size() > CMessageHeader::COMMAND_SIZE) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Error: msg_type too long, max length is %i", CMessageHeader::COMMAND_SIZE));
            }
            auto msg{TryParseHex<unsigned char>(request.params[2].get_str())};
            if (!msg.has_value()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Error parsing input for msg");
            }

            NodeContext& node = EnsureAnyNodeContext(request.context);
            CConnman& connman = EnsureConnman(node);

            CSerializedNetMsg msg_ser;
            msg_ser.data = msg.value();
            msg_ser.m_type = msg_type;

            bool success = connman.ForNode(peer_id, [&](CNode* node) {
                connman.PushMessage(node, std::move(msg_ser));
                return true;
            });

            if (!success) {
                throw JSONRPCError(RPC_MISC_ERROR, "Error: Could not send message to peer");
            }

            UniValue ret{UniValue::VOBJ};
            return ret;
        },
    };
}